

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

void Curl_sasl_init(SASL *sasl,SASLproto *params)

{
  sasl->params = params;
  sasl->state = SASL_STOP;
  sasl->authmechs = 0;
  sasl->prefmech = 0xffffff5f;
  sasl->authused = 0;
  sasl->resetprefs = true;
  sasl->mutual_auth = false;
  sasl->force_ir = false;
  return;
}

Assistant:

void Curl_sasl_init(struct SASL *sasl, const struct SASLproto *params)
{
  sasl->params = params;           /* Set protocol dependent parameters */
  sasl->state = SASL_STOP;         /* Not yet running */
  sasl->authmechs = SASL_AUTH_NONE; /* No known authentication mechanism yet */
  sasl->prefmech = SASL_AUTH_DEFAULT; /* Prefer all mechanisms */
  sasl->authused = SASL_AUTH_NONE; /* No the authentication mechanism used */
  sasl->resetprefs = TRUE;         /* Reset prefmech upon AUTH parsing. */
  sasl->mutual_auth = FALSE;       /* No mutual authentication (GSSAPI only) */
  sasl->force_ir = FALSE;          /* Respect external option */
}